

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  Policy policy_00;
  Policy policy_01;
  Policy policy_02;
  bool bVar1;
  undefined1 uVar2;
  byte bVar3;
  Cache *pCVar4;
  MemoryManager *this;
  uint64_t pc;
  elfio reader;
  Simulator simulator;
  BranchPredictor branch_predictor;
  Policy policy;
  MemoryManager memory;
  MemoryManager *this_00;
  uint32_t max_size;
  uint32_t in_stack_ffffffffffff9b3c;
  BranchPredictor *in_stack_ffffffffffff9b40;
  MemoryManager *in_stack_ffffffffffff9b48;
  Simulator *in_stack_ffffffffffff9b50;
  MemoryManager *in_stack_ffffffffffff9b58;
  Cache *in_stack_ffffffffffff9b60;
  MemoryManager *in_stack_ffffffffffff9b68;
  undefined6 in_stack_ffffffffffff9b70;
  undefined1 in_stack_ffffffffffff9b76;
  undefined1 in_stack_ffffffffffff9b77;
  undefined8 in_stack_ffffffffffff9b78;
  char *pc_00;
  uint32_t in_stack_ffffffffffff9b80;
  Simulator *this_01;
  char **in_stack_ffffffffffff9b88;
  int in_stack_ffffffffffff9b90;
  allocator<char> local_6451;
  string local_6450 [432];
  string *in_stack_ffffffffffff9d60;
  elfio *in_stack_ffffffffffff9d68;
  BranchPredictor local_60c0;
  undefined8 local_2098;
  MemoryManager *pMStack_2090;
  uint32_t local_2088;
  undefined8 local_2078;
  undefined8 uStack_2070;
  undefined4 local_2068;
  undefined8 local_2058;
  undefined8 uStack_2050;
  undefined4 local_2048;
  undefined4 local_202c;
  undefined4 uStack_2028;
  undefined4 uStack_2024;
  undefined4 uStack_2020;
  uint32_t local_201c;
  MemoryManager local_2018;
  int local_4;
  
  local_4 = 0;
  bVar1 = parsePara(in_stack_ffffffffffff9b90,in_stack_ffffffffffff9b88);
  if (!bVar1) {
    printUsage();
    exit(-1);
  }
  MemoryManager::MemoryManager(&local_2018);
  local_202c = 0x800000;
  uStack_2028 = 0x40;
  uStack_2024 = 0x20000;
  uStack_2020 = 8;
  local_201c = 0x13;
  pCVar4 = (Cache *)operator_new(0x80);
  local_2048 = local_201c;
  local_2058 = CONCAT44(uStack_2028,local_202c);
  uStack_2050 = CONCAT44(uStack_2020,uStack_2024);
  policy_00.block_size._2_1_ = in_stack_ffffffffffff9b76;
  policy_00._0_6_ = in_stack_ffffffffffff9b70;
  policy_00.block_size._3_1_ = in_stack_ffffffffffff9b77;
  policy_00.block_num = (int)in_stack_ffffffffffff9b78;
  policy_00.associativity = (int)((ulong)in_stack_ffffffffffff9b78 >> 0x20);
  policy_00.hit_latency = in_stack_ffffffffffff9b80;
  Cache::Cache(in_stack_ffffffffffff9b60,in_stack_ffffffffffff9b58,policy_00,
               (Cache *)in_stack_ffffffffffff9b50,SUB81((ulong)in_stack_ffffffffffff9b48 >> 0x38,0),
               SUB81((ulong)in_stack_ffffffffffff9b48 >> 0x30,0),(uint32_t)in_stack_ffffffffffff9b48
              );
  local_202c = 0x40000;
  uStack_2028 = 0x40;
  uStack_2024 = 0x1000;
  uStack_2020 = 8;
  local_201c = 7;
  l3_cache = pCVar4;
  pCVar4 = (Cache *)operator_new(0x80);
  local_2068 = local_201c;
  local_2078 = CONCAT44(uStack_2028,local_202c);
  uStack_2070 = CONCAT44(uStack_2020,uStack_2024);
  policy_01.block_size._2_1_ = in_stack_ffffffffffff9b76;
  policy_01._0_6_ = in_stack_ffffffffffff9b70;
  policy_01.block_size._3_1_ = in_stack_ffffffffffff9b77;
  policy_01.block_num = (int)in_stack_ffffffffffff9b78;
  policy_01.associativity = (int)((ulong)in_stack_ffffffffffff9b78 >> 0x20);
  policy_01.hit_latency = in_stack_ffffffffffff9b80;
  Cache::Cache(in_stack_ffffffffffff9b60,in_stack_ffffffffffff9b58,policy_01,
               (Cache *)in_stack_ffffffffffff9b50,SUB81((ulong)in_stack_ffffffffffff9b48 >> 0x38,0),
               SUB81((ulong)in_stack_ffffffffffff9b48 >> 0x30,0),(uint32_t)in_stack_ffffffffffff9b48
              );
  l2_cache = pCVar4;
  local_202c = 0x8000;
  uStack_2028 = 0x40;
  uStack_2024 = 0x200;
  uStack_2020 = 8;
  local_201c = 0;
  pCVar4 = (Cache *)operator_new(0x80);
  local_2088 = local_201c;
  local_2098 = CONCAT44(uStack_2028,local_202c);
  this_00 = (MemoryManager *)CONCAT44(uStack_2020,uStack_2024);
  policy_02.block_size._2_1_ = in_stack_ffffffffffff9b76;
  policy_02._0_6_ = in_stack_ffffffffffff9b70;
  policy_02.block_size._3_1_ = in_stack_ffffffffffff9b77;
  policy_02.block_num = (int)in_stack_ffffffffffff9b78;
  policy_02.associativity = (int)((ulong)in_stack_ffffffffffff9b78 >> 0x20);
  policy_02.hit_latency = in_stack_ffffffffffff9b80;
  max_size = local_201c;
  pMStack_2090 = this_00;
  Cache::Cache(in_stack_ffffffffffff9b60,in_stack_ffffffffffff9b58,policy_02,
               (Cache *)in_stack_ffffffffffff9b50,SUB81((ulong)in_stack_ffffffffffff9b48 >> 0x38,0),
               SUB81((ulong)in_stack_ffffffffffff9b48 >> 0x30,0),(uint32_t)in_stack_ffffffffffff9b48
              );
  l1_cache = pCVar4;
  MemoryManager::setCache(&local_2018,l1_cache);
  BranchPredictor::BranchPredictor(&local_60c0,strategy);
  Simulator::Simulator
            (in_stack_ffffffffffff9b50,in_stack_ffffffffffff9b48,in_stack_ffffffffffff9b40);
  ELFIO::elfio::elfio((elfio *)in_stack_ffffffffffff9b50);
  this_01 = (Simulator *)&local_6451;
  pc_00 = elf_file_name;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6450,pc_00,(allocator *)this_01);
  uVar2 = ELFIO::elfio::load(in_stack_ffffffffffff9d68,in_stack_ffffffffffff9d60);
  bVar3 = uVar2 ^ 0xff;
  std::__cxx11::string::~string(local_6450);
  std::allocator<char>::~allocator(&local_6451);
  if ((bVar3 & 1) == 0) {
    loadElf((elfio *)CONCAT17(uVar2,CONCAT16(bVar3,in_stack_ffffffffffff9b70)),
            in_stack_ffffffffffff9b68);
    if ((verbose & 1U) != 0) {
      MemoryManager::printInfo(this_00);
    }
    Simulator::initStack((Simulator *)in_stack_ffffffffffff9b40,in_stack_ffffffffffff9b3c,max_size);
    ELFIO::elfio::get_entry((elfio *)this_00);
    this = (MemoryManager *)ELFIO::elfio::get_entry((elfio *)this_00);
    Simulator::run(this_01,(uint64_t)pc_00);
    if (l1_cache != (Cache *)0x0) {
      pCVar4 = l1_cache;
      Cache::~Cache((Cache *)0x105f57);
      operator_delete(pCVar4);
    }
    if (l2_cache != (Cache *)0x0) {
      pCVar4 = l2_cache;
      Cache::~Cache((Cache *)0x105f7d);
      operator_delete(pCVar4);
    }
    if (l3_cache != (Cache *)0x0) {
      pCVar4 = l3_cache;
      Cache::~Cache((Cache *)0x105fa3);
      operator_delete(pCVar4);
    }
    local_4 = 0;
    ELFIO::elfio::~elfio((elfio *)this_00);
    Simulator::~Simulator((Simulator *)0x105fd2);
    BranchPredictor::~BranchPredictor(&local_60c0);
    MemoryManager::~MemoryManager(this);
    return local_4;
  }
  fprintf(_stderr,"Failure on loading ELF File\n");
  exit(-1);
}

Assistant:

int main(int argc, char **argv) {
    if (!parsePara(argc, argv)) {
        printUsage();
        exit(-1);
    }
    MemoryManager memory;
    Cache::Policy policy;

    policy.cache_size = 8 * 1024 * 1024;
    policy.block_size = 64;
    policy.block_num = policy.cache_size / policy.block_size;
    policy.associativity = 8;
    policy.hit_latency = 19;
//    policy.miss_latency = 100;
    l3_cache = new Cache(&memory, policy, nullptr, true, true);

    policy.cache_size = 256 * 1024;
    policy.block_size = 64;
    policy.block_num = policy.cache_size / policy.block_size;
    policy.associativity = 8;
    policy.hit_latency = 7;
//    policy.miss_latency = 20;
    l2_cache = new Cache(&memory, policy, l3_cache, true, true);

    policy.cache_size = 32 * 1024;
    policy.block_size = 64;
    policy.block_num = policy.cache_size / policy.block_size;
    policy.associativity = 8;
    policy.hit_latency = 0;
//    policy.miss_latency = 8;
    l1_cache = new Cache(&memory, policy, l2_cache, true, true);

    memory.setCache(l1_cache);

    BranchPredictor branch_predictor(strategy);
    Simulator simulator(&memory, &branch_predictor);

    ELFIO::elfio reader;
    if (!reader.load(elf_file_name)) {
        fprintf(stderr, "Failure on loading ELF File\n");
        exit(-1);
    }

    loadElf(&reader, &memory);

    if (verbose) {
//        printELFInfo(&reader);
        memory.printInfo();
    }

    simulator.is_single_step = single_step;
    simulator.is_verbose = verbose;
    simulator.is_dump_history = dump_history;
    simulator.initStack(0x80000000, 0x400000);
//    printf("%d %d %d %d\n",single_step, verbose, dump_history, strategy);
    uint64_t pc = reader.get_entry();
//    printf("Entry: %llx\n", pc);
    simulator.run(reader.get_entry());

//    if(dump_history){
//        simulator.dumpHistory();
//    }
    delete l1_cache;
    delete l2_cache;
    delete l3_cache;

    return 0;
}